

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall mp::SPAdapter::ProcessObjs(SPAdapter *this)

{
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *this_00;
  double dVar1;
  SPAdapter *pSVar2;
  int iVar3;
  pointer pBVar4;
  pointer pLVar5;
  size_ty sVar6;
  pointer piVar7;
  int iVar8;
  int *piVar9;
  Impl *pIVar10;
  Error *pEVar11;
  int *piVar12;
  ulong uVar13;
  ColProblem *pCVar14;
  ExprBase e;
  uint uVar15;
  vector<double,_std::allocator<double>_> core_obj;
  vector<double,_std::allocator<double>_> local_80;
  double local_68;
  Term local_60;
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  undefined8 uStack_40;
  Impl *local_38;
  
  iVar8 = (int)((long)(this->problem_->super_Problem).linear_objs_.
                      super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->problem_->super_Problem).linear_objs_.
                      super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x11111111;
  if (iVar8 != 0) {
    iVar3 = *(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &this->nonlinear_objs_;
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
    ::reserve(this_00,(long)iVar8);
    pCVar14 = this->problem_;
    uVar15 = (int)((ulong)((long)(pCVar14->super_Problem).linear_objs_.
                                 super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar14->super_Problem).linear_objs_.
                                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
    if (uVar15 != 0) {
      uVar13 = 0;
      do {
        pBVar4 = (pCVar14->super_Problem).nonlinear_objs_.
                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar13 < (ulong)((long)(pCVar14->super_Problem).nonlinear_objs_.
                                   super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 3))
        {
          local_60._0_8_ = pBVar4[uVar13].super_ExprBase.impl_;
        }
        else {
          local_60._0_8_ = (Impl *)0x0;
        }
        std::
        vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
        ::emplace_back<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
                    *)this_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_60);
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
      pCVar14 = this->problem_;
    }
    uVar15 = (uint)((ulong)((long)(this->var_core2orig_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->var_core2orig_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_80,(long)(int)uVar15,(allocator_type *)&local_60);
    pLVar5 = (pCVar14->super_Problem).linear_objs_.
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = *(size_ty *)
             ((long)&(pLVar5->terms_).
                     super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10);
    if (sVar6 != 0) {
      piVar12 = *(int **)&(pLVar5->terms_).
                          super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
      piVar9 = piVar12 + sVar6 * 4;
      piVar7 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar8 = piVar7[*piVar12];
        dVar1 = *(double *)(piVar12 + 2);
        if ((iVar3 <= iVar8) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
          pEVar11 = (Error *)__cxa_allocate_exception(0x18);
          Error::Error(pEVar11,(CStringRef)0x16e9ca,-1);
          __cxa_throw(pEVar11,&Error::typeinfo,fmt::SystemError::~SystemError);
        }
        local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar8] = dVar1;
        piVar12 = piVar12 + 4;
      } while (piVar12 != piVar9);
    }
    pBVar4 = (pCVar14->super_Problem).nonlinear_objs_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((pCVar14->super_Problem).nonlinear_objs_.
         super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != pBVar4) &&
       (e.impl_ = (pBVar4->super_ExprBase).impl_, e.impl_ != (Impl *)0x0)) {
      if ((e.impl_)->kind_ == CALL) {
        iVar8 = strcmp((char *)(*(long *)(e.impl_ + 2) + 8),"expectation");
        if (iVar8 == 0) {
          if ((e.impl_[4].kind_ != FIRST_EXPR) ||
             (e.impl_ = *(Impl **)(e.impl_ + 6), (e.impl_)->kind_ - BOOL < 0xffffffd1)) {
            pEVar11 = (Error *)__cxa_allocate_exception(0x18);
            Error::Error(pEVar11,(CStringRef)0x16eb2c,-1);
            __cxa_throw(pEVar11,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          (((this_00->
            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
            )._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ = (Impl *)0x0;
        }
      }
      local_60._0_8_ = &PTR__BasicExprVisitor_0019a688;
      local_48 = 0.0;
      uStack_40 = 0x3ff0000000000000;
      local_60.coef_ = (double)this;
      local_50 = &local_80;
      BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>
                  *)&local_60,(Expr)e.impl_);
      local_68 = local_48;
      if ((local_48 != 0.0) || (NAN(local_48))) {
        local_38 = (Impl *)0x0;
        std::
        vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
        ::emplace_back<mp::internal::ExprBase::Impl_const*>
                  ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                    *)&(this->factory_).exprs_,&local_38);
        pIVar10 = (Impl *)operator_new__(0x80);
        pIVar10->kind_ = FIRST_EXPR;
        (this->factory_).exprs_.
        super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar10;
        *(double *)(pIVar10 + 2) = local_68;
        (((this->nonlinear_objs_).
          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ = pIVar10;
      }
    }
    if (0 < (int)uVar15) {
      uVar13 = 0;
      do {
        pSVar2 = (SPAdapter *)
                 local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        if (((double)pSVar2 != 0.0) || (NAN((double)pSVar2))) {
          local_60.var_index_ = (int)uVar13;
          local_60.coef_ = (double)pSVar2;
          gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
          append_element<mp::LinearExpr::Term>
                    ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
                     &this->linear_obj_,&local_60);
        }
        uVar13 = uVar13 + 1;
      } while ((uVar15 & 0x7fffffff) != uVar13);
    }
    if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SPAdapter::ProcessObjs() {
  int num_objs = problem_.num_objs();
  if (num_objs == 0)
    return;
  int num_stage1_vars = num_stage_vars_[0];
  nonlinear_objs_.reserve(num_objs);
  auto objs = problem_.objs();
  for (auto i = objs.begin(), end = objs.end(); i != end; ++i)
    nonlinear_objs_.push_back(i->nonlinear_expr());
  // Strip expectation from the first objective.
  auto obj = problem_.obj(0);
  int num_vars = this->num_vars();
  std::vector<double> core_obj(num_vars);
  const auto &linear = obj.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i) {
    int core_var_index = var_orig2core_[i->var_index()];
    if (core_var_index >= num_stage1_vars && i->coef() != 0)
      throw Error("second-stage variable outside of expectation in objective");
    core_obj[core_var_index] = i->coef();
  }
  auto obj_expr = obj.nonlinear_expr();
  if (obj_expr) {
    auto call = Cast<CallExpr>(obj_expr);
    if (call && std::strcmp(call.function().name(), "expectation") == 0) {
      if (call.num_args() != 1 || !(obj_expr = Cast<NumericExpr>(call.arg(0))))
        throw Error("invalid arguments to expectation");
      nonlinear_objs_[0] = mp::NumericExpr();
    }
    internal::AffineExprExtractor extractor(*this, core_obj);
    extractor.Visit(obj_expr);
    if (auto constant = extractor.constant())
      nonlinear_objs_[0] = factory_.MakeNumericConstant(constant);
  }
  for (int i = 0; i < num_vars; ++i) {
    if (auto obj = core_obj[i])
      linear_obj_.AddTerm(i, obj);
  }
}